

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O0

int __thiscall QtMWidgets::TextLabel::heightForWidth(TextLabel *this,int w)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  TextLabelPrivate *pTVar7;
  qreal qVar8;
  undefined1 auVar9 [16];
  QSizeF local_b0;
  QTextOption local_a0 [24];
  QString local_88;
  QTextDocument local_70 [8];
  QTextDocument doc;
  qreal width;
  QMargins margins;
  QString local_38;
  int local_1c;
  TextLabel *pTStack_18;
  int w_local;
  TextLabel *this_local;
  
  local_1c = w;
  pTStack_18 = this;
  text(&local_38,this);
  bVar1 = QString::isEmpty(&local_38);
  QString::~QString(&local_38);
  if (bVar1) {
    iVar5 = QFrame::frameWidth();
    this_local._4_4_ = iVar5 << 1;
  }
  else {
    auVar9 = QWidget::contentsMargins();
    iVar6 = local_1c;
    margins._0_8_ = auVar9._8_8_;
    register0x00000000 = auVar9._0_8_;
    iVar2 = QFrame::frameWidth();
    iVar3 = QMargins::left((QMargins *)((long)&width + 4));
    iVar4 = QMargins::right((QMargins *)((long)&width + 4));
    pTVar7 = QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
             ::operator->(&this->d);
    iVar5 = pTVar7->margin;
    QTextDocument::QTextDocument(local_70,(QObject *)0x0);
    QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
    ::operator->(&this->d);
    QStaticText::text();
    QTextDocument::setHtml((QString *)local_70);
    QString::~QString(&local_88);
    QTextDocument::setTextWidth((double)((((iVar6 + iVar2 * -2) - iVar3) - iVar4) + iVar5 * -2));
    QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
    ::operator->(&this->d);
    QStaticText::textOption();
    QTextDocument::setDefaultTextOption((QTextOption *)local_70);
    QTextOption::~QTextOption(local_a0);
    local_b0.wd = (qreal)QTextDocument::size();
    qVar8 = QSizeF::height(&local_b0);
    iVar5 = QFrame::frameWidth();
    iVar6 = QMargins::top((QMargins *)((long)&width + 4));
    iVar2 = QMargins::bottom((QMargins *)((long)&width + 4));
    pTVar7 = QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
             ::operator->(&this->d);
    this_local._4_4_ =
         (int)(qVar8 + (double)(iVar5 << 1) + (double)iVar6 + (double)iVar2 +
              (double)(pTVar7->margin << 1));
    QTextDocument::~QTextDocument(local_70);
  }
  return this_local._4_4_;
}

Assistant:

int
TextLabel::heightForWidth( int w ) const
{
	if( text().isEmpty() )
		return 2 * frameWidth();

	const QMargins margins = contentsMargins();

	const qreal width = w - 2 * frameWidth() - margins.left() -
		margins.right() - 2 * d->margin;

	QTextDocument doc;
	doc.setHtml( d->staticText.text() );
	doc.setTextWidth( width );
	doc.setDefaultTextOption( d->staticText.textOption() );

	return doc.size().height() +
		2 * frameWidth() + margins.top() +
		margins.bottom() + 2 * d->margin;
}